

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

DbPage * sqlite3PagerLookup(Pager *pPager,Pgno pgno)

{
  sqlite3_pcache_page *pPage;
  PgHdr *pPVar1;
  
  pPage = (*sqlite3Config.pcache2.xFetch)(pPager->pPCache->pCache,pgno,0);
  if (pPage != (sqlite3_pcache_page *)0x0) {
    pPVar1 = sqlite3PcacheFetchFinish(pPager->pPCache,pgno,pPage);
    return pPVar1;
  }
  return (DbPage *)0x0;
}

Assistant:

SQLITE_PRIVATE DbPage *sqlite3PagerLookup(Pager *pPager, Pgno pgno){
  sqlite3_pcache_page *pPage;
  assert( pPager!=0 );
  assert( pgno!=0 );
  assert( pPager->pPCache!=0 );
  pPage = sqlite3PcacheFetch(pPager->pPCache, pgno, 0);
  assert( pPage==0 || pPager->hasHeldSharedLock );
  if( pPage==0 ) return 0;
  return sqlite3PcacheFetchFinish(pPager->pPCache, pgno, pPage);
}